

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moveGeneration.cpp
# Opt level: O3

void setAllToZero(bitboards *game,U64 endMask)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong uVar7;
  undefined1 auVar8 [16];
  
  uVar7 = ~endMask;
  auVar8._8_4_ = (int)uVar7;
  auVar8._0_8_ = uVar7;
  auVar8._12_4_ = (int)(uVar7 >> 0x20);
  auVar1._0_8_ = game->WP;
  auVar1._8_8_ = game->WN;
  auVar2._0_8_ = game->WB;
  auVar2._8_8_ = game->WR;
  auVar3._0_8_ = game->WQ;
  auVar3._8_8_ = game->WK;
  auVar4._0_8_ = game->BP;
  auVar4._8_8_ = game->BN;
  game->WP = SUB168(auVar1 & auVar8,0);
  game->WN = SUB168(auVar1 & auVar8,8);
  game->WB = SUB168(auVar2 & auVar8,0);
  game->WR = SUB168(auVar2 & auVar8,8);
  game->WQ = SUB168(auVar3 & auVar8,0);
  game->WK = SUB168(auVar3 & auVar8,8);
  game->BP = SUB168(auVar4 & auVar8,0);
  game->BN = SUB168(auVar4 & auVar8,8);
  auVar5._0_8_ = game->BB;
  auVar5._8_8_ = game->BR;
  game->BB = SUB168(auVar5 & auVar8,0);
  game->BR = SUB168(auVar5 & auVar8,8);
  auVar6._0_8_ = game->BQ;
  auVar6._8_8_ = game->BK;
  game->BQ = SUB168(auVar6 & auVar8,0);
  game->BK = SUB168(auVar6 & auVar8,8);
  return;
}

Assistant:

void setAllToZero(bitboards* game, U64 endMask) {
  U64 mask = ~endMask;
  game->WP &= mask;
  game->WN &= mask;
  game->WB &= mask;
  game->WR &= mask;
  game->WQ &= mask;
  game->WK &= mask;
  game->BP &= mask;
  game->BN &= mask;
  game->BB &= mask;
  game->BR &= mask;
  game->BQ &= mask;
  game->BK &= mask;
}